

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalarestimator.cxx
# Opt level: O2

int __thiscall ScalarEstimator::init(ScalarEstimator *this,EVP_PKEY_CTX *ctx)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  
  (this->super_Estimator).nSamples = 0;
  this->dSample = 0.0;
  this->dOne = 0.0;
  this->dTwo = 0.0;
  this->dThree = 0.0;
  pdVar1 = this->aDist;
  if (pdVar1 != (double *)0x0) {
    uVar3 = 0;
    uVar2 = (ulong)(uint)this->nDist;
    if (this->nDist < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      pdVar1[uVar3] = 0.0;
    }
  }
  return (int)pdVar1;
}

Assistant:

void ScalarEstimator::init()
{
	nSamples = 0;
	dSample = 0.0;
	dOne = 0.0;
	dTwo = 0.0;
	dThree = 0.0;
	if(aDist)
		for(int i=0; i<nDist; i++)
			aDist[i] = 0.0;
}